

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O0

void __thiscall mir::inst::OpAccInst::display(OpAccInst *this,ostream *o)

{
  ostream *poVar1;
  ostream *in_RSI;
  Displayable *in_RDI;
  
  poVar1 = prelude::operator<<(in_RSI,in_RDI);
  std::operator<<(poVar1," = ");
  display_op(in_RSI,(OpAcc)((ulong)in_RDI >> 0x20));
  std::operator<<(in_RSI," ");
  poVar1 = prelude::operator<<(in_RSI,in_RDI);
  std::operator<<(poVar1,", ");
  poVar1 = prelude::operator<<(in_RSI,in_RDI);
  std::operator<<(poVar1,", ");
  prelude::operator<<(in_RSI,in_RDI);
  return;
}

Assistant:

void OpAccInst::display(std::ostream& o) const {
  o << dest << " = ";
  display_op(o, op);
  o << " " << lhs << ", " << rhs << ", " << acc;
}